

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

LocaleKey *
icu_63::LocaleKey::createWithCanonicalFallback
          (UnicodeString *primaryID,UnicodeString *canonicalFallbackID,int32_t kind,
          UErrorCode *status)

{
  UBool UVar1;
  LocaleKey *this;
  UnicodeString *this_00;
  LocaleKey *local_a0;
  undefined1 local_70 [8];
  UnicodeString canonicalPrimaryID;
  UErrorCode *status_local;
  int32_t kind_local;
  UnicodeString *canonicalFallbackID_local;
  UnicodeString *primaryID_local;
  
  if ((primaryID != (UnicodeString *)0x0) &&
     (canonicalPrimaryID.fUnion._48_8_ = status, UVar1 = ::U_FAILURE(*status), UVar1 == '\0')) {
    this_00 = (UnicodeString *)local_70;
    UnicodeString::UnicodeString(this_00);
    LocaleUtility::canonicalLocaleString(primaryID,this_00);
    this = (LocaleKey *)UMemory::operator_new((UMemory *)0x110,(size_t)this_00);
    local_a0 = (LocaleKey *)0x0;
    if (this != (LocaleKey *)0x0) {
      LocaleKey(this,primaryID,(UnicodeString *)local_70,canonicalFallbackID,kind);
      local_a0 = this;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_70);
    return local_a0;
  }
  return (LocaleKey *)0x0;
}

Assistant:

LocaleKey*
LocaleKey::createWithCanonicalFallback(const UnicodeString* primaryID,
                                       const UnicodeString* canonicalFallbackID,
                                       int32_t kind,
                                       UErrorCode& status)
{
    if (primaryID == NULL || U_FAILURE(status)) {
        return NULL;
    }
    UnicodeString canonicalPrimaryID;
    LocaleUtility::canonicalLocaleString(primaryID, canonicalPrimaryID);
    return new LocaleKey(*primaryID, canonicalPrimaryID, canonicalFallbackID, kind);
}